

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O2

void __thiscall
CGL::SceneObjects::InfiniteHemisphereLight::InfiniteHemisphereLight
          (InfiniteHemisphereLight *this,Vector3D *rad)

{
  Matrix3x3 *this_00;
  undefined1 auVar1 [16];
  Vector3D *pVVar2;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_0011a9c8;
  (this->radiance).field_0.field_0.x = (rad->field_0).field_0.x;
  (this->radiance).field_0.field_0.y = (rad->field_0).field_0.y;
  (this->radiance).field_0.field_0.z = (rad->field_0).field_0.z;
  this_00 = &this->sampleToWorld;
  Matrix3x3::Matrix3x3(this_00);
  *(code **)&this->sampler = CGL::BSDF::refract;
  pVVar2 = Matrix3x3::operator[](this_00,0);
  (pVVar2->field_0).field_0.x = 1.0;
  (pVVar2->field_0).field_0.y = 0.0;
  (pVVar2->field_0).field_0.z = 0.0;
  pVVar2 = Matrix3x3::operator[](this_00,1);
  (pVVar2->field_0).field_0.x = 0.0;
  (pVVar2->field_0).field_0.y = 0.0;
  (pVVar2->field_0).field_0.z = -1.0;
  pVVar2 = Matrix3x3::operator[](this_00,2);
  auVar1 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  *(undefined1 (*) [16])(pVVar2->field_0).field_2.__vec = auVar1;
  (pVVar2->field_0).field_0.z = 0.0;
  return;
}

Assistant:

InfiniteHemisphereLight::InfiniteHemisphereLight(const Vector3D rad)
    : radiance(rad) {
  sampleToWorld[0] = Vector3D(1,  0,  0);
  sampleToWorld[1] = Vector3D(0,  0, -1);
  sampleToWorld[2] = Vector3D(0,  1,  0);
}